

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_interpolation_with_magic_number.cc
# Opt level: O0

void __thiscall
sptk::InputSourceInterpolationWithMagicNumber::CalculateIncrement
          (InputSourceInterpolationWithMagicNumber *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  long in_RDI;
  int i;
  double rate;
  int local_14;
  
  iVar3 = *(int *)(in_RDI + 0xc);
  iVar4 = *(int *)(in_RDI + 8);
  local_14 = 0;
  do {
    if (*(int *)(in_RDI + 0x24) <= local_14) {
      return;
    }
    dVar1 = *(double *)(in_RDI + 0x18);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),(long)local_14);
    if ((dVar1 != *pvVar5) || (NAN(dVar1) || NAN(*pvVar5))) {
      dVar1 = *(double *)(in_RDI + 0x18);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),(long)local_14)
      ;
      if ((dVar1 == *pvVar5) && (!NAN(dVar1) && !NAN(*pvVar5))) goto LAB_0010721b;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),(long)local_14)
      ;
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),(long)local_14)
      ;
      dVar2 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),(long)local_14)
      ;
      *pvVar5 = ((double)iVar3 / (double)iVar4) * (dVar1 - dVar2);
    }
    else {
LAB_0010721b:
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),(long)local_14)
      ;
      *pvVar5 = 1.79769313486232e+308;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void InputSourceInterpolationWithMagicNumber::CalculateIncrement() {
  const double rate(static_cast<double>(interpolation_period_) / frame_period_);
  for (int i(0); i < data_length_; ++i) {
    if (magic_number_ == next_data_[i] || magic_number_ == curr_data_[i]) {
      increment_[i] = kCannotCalculateIncrements;
    } else {
      increment_[i] = rate * (next_data_[i] - curr_data_[i]);
    }
  }
}